

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  int iVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  char *pcVar5;
  uint uVar6;
  char *__s;
  bool bVar7;
  char *pcVar8;
  
  pIVar4 = GImGui;
  if ((text_end == (char *)0x0) && (text_end = text, text != (char *)0xffffffffffffffff)) {
    do {
      if (*text_end == '#') {
        if (text_end[1] == '#') goto LAB_0011eb80;
      }
      else if (*text_end == '\0') goto LAB_0011eb80;
      text_end = text_end + 1;
    } while (text_end != (char *)0xffffffffffffffff);
    text_end = (char *)0xffffffffffffffff;
  }
LAB_0011eb80:
  pIVar3 = GImGui->CurrentWindow;
  if (ref_pos == (ImVec2 *)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = (pIVar3->DC).LogLinePosY + 1.0 < ref_pos->y;
    (pIVar3->DC).LogLinePosY = ref_pos->y;
  }
  iVar1 = (pIVar3->DC).TreeDepth;
  if (iVar1 < pIVar4->LogStartDepth) {
    pIVar4->LogStartDepth = iVar1;
  }
  iVar2 = pIVar4->LogStartDepth;
  __s = text;
  do {
    pcVar5 = (char *)memchr(__s,10,(long)text_end - (long)__s);
    pcVar8 = text_end;
    if (pcVar5 != (char *)0x0) {
      pcVar8 = pcVar5;
    }
    if (__s != pcVar8 || pcVar8 != text_end) {
      uVar6 = (int)pcVar8 - (int)__s;
      if ((bool)(~bVar7 & __s == text)) {
        LogText(" %.*s",(ulong)uVar6,__s);
      }
      else {
        LogText("\n%*s%.*s",(ulong)(uint)((iVar1 - iVar2) * 4),"",(ulong)uVar6,__s);
      }
    }
    __s = pcVar8 + 1;
  } while (pcVar8 != text_end);
  return;
}

Assistant:

void ImGui::LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!text_end)
        text_end = FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > window->DC.LogLinePosY + 1);
    if (ref_pos)
        window->DC.LogLinePosY = ref_pos->y;

    const char* text_remaining = text;
    if (g.LogStartDepth > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogStartDepth = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogStartDepth);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        const char* line_start = text_remaining;
        const char* line_end = ImStreolRange(line_start, text_end);
        const bool is_first_line = (line_start == text);
        const bool is_last_line = (line_end == text_end);
        if (!is_last_line || (line_start != line_end))
        {
            const int char_count = (int)(line_end - line_start);
            if (log_new_line || !is_first_line)
                LogText(IM_NEWLINE "%*s%.*s", tree_depth*4, "", char_count, line_start);
            else
                LogText(" %.*s", char_count, line_start);
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}